

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O1

NetSymbol *
slang::ast::NetSymbol::createImplicit
          (Compilation *compilation,IdentifierNameSyntax *syntax,NetType *netType)

{
  NetSymbol *pNVar1;
  Token t;
  SourceLocation local_50;
  Token local_48;
  string_view local_38;
  
  local_48.kind = (syntax->identifier).kind;
  local_48._2_1_ = (syntax->identifier).field_0x2;
  local_48.numFlags.raw = (syntax->identifier).numFlags.raw;
  local_48.rawLen = (syntax->identifier).rawLen;
  local_48.info = (syntax->identifier).info;
  local_38 = parsing::Token::valueText(&local_48);
  local_50 = parsing::Token::location(&local_48);
  pNVar1 = BumpAllocator::
           emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                     (&compilation->super_BumpAllocator,&local_38,&local_50,netType);
  (pNVar1->super_ValueSymbol).declaredType.type = compilation->logicType;
  pNVar1->isImplicit = true;
  (pNVar1->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  return pNVar1;
}

Assistant:

NetSymbol& NetSymbol::createImplicit(Compilation& compilation, const IdentifierNameSyntax& syntax,
                                     const NetType& netType) {
    auto t = syntax.identifier;
    auto net = compilation.emplace<NetSymbol>(t.valueText(), t.location(), netType);
    net->setType(compilation.getLogicType());
    net->isImplicit = true;
    net->setSyntax(syntax);
    return *net;
}